

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingUtils.h
# Opt level: O2

bool Assimp::SkipSpacesAndLineEnd<char>(char *in,char **out)

{
  while (((ulong)(byte)*in < 0x21 && ((0x100002600U >> ((ulong)(byte)*in & 0x3f) & 1) != 0))) {
    in = (char *)((byte *)in + 1);
  }
  *out = in;
  return *in != 0;
}

Assistant:

AI_FORCE_INLINE
bool SkipSpacesAndLineEnd( const char_t* in, const char_t** out) {
    while( *in == ( char_t )' ' || *in == ( char_t )'\t' || *in == ( char_t )'\r' || *in == ( char_t )'\n' ) {
        ++in;
    }
    *out = in;
    return *in != '\0';
}